

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O3

char __thiscall AggressiveBotStrategy::yesOrNo(AggressiveBotStrategy *this,StrategyContext context)

{
  bool bVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  char cVar3;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  if (context == REINFORCE) {
    cVar3 = 'y';
  }
  else {
    if (context == FORTIFY) {
      bVar1 = canFortify(this);
    }
    else {
      if (context != ATTACK) {
        cVar3 = 'n';
        goto LAB_00109e89;
      }
      bVar1 = canAttack(this);
    }
    cVar3 = 'n';
    if (bVar1 != false) {
      cVar3 = 'y';
    }
  }
LAB_00109e89:
  uStack_18 = CONCAT17(cVar3,(undefined7)uStack_18);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)((long)&uStack_18 + 7),1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return cVar3;
}

Assistant:

signed char AggressiveBotStrategy::yesOrNo(StrategyContext context) {
    char botChoice = 0;
    switch ((int) context) {
        case StrategyContext::ATTACK:
            botChoice = canAttack() ? 'y' : 'n';
            break;
        case StrategyContext::FORTIFY:
            botChoice = canFortify() ? 'y' : 'n';
            break;
        case StrategyContext::REINFORCE:
            botChoice = 'y';
            break;
        default: {
            // Should never occur
            botChoice = 'n';
        }
    }
    std::cout << botChoice << std::endl;
    return botChoice;
}